

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracyProfiler.cpp
# Opt level: O0

DequeueStatus __thiscall
tracy::Profiler::DequeueContextSwitches(Profiler *this,ConsumerToken *token,int64_t *timeStop)

{
  ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits> *pCVar1;
  size_t sVar2;
  size_t sz;
  int64_t *timeStop_local;
  ConsumerToken *token_local;
  Profiler *this_local;
  
  pCVar1 = GetQueue();
  sVar2 = moodycamel::
          ConcurrentQueue<tracy::QueueItem,tracy::moodycamel::ConcurrentQueueDefaultTraits>::
          try_dequeue_bulk_single<tracy::Profiler::DequeueContextSwitches(tracy::moodycamel::ConsumerToken&,long&)::__0,tracy::Profiler::DequeueContextSwitches(tracy::moodycamel::ConsumerToken&,long&)::__1>
                    ((ConcurrentQueue<tracy::QueueItem,tracy::moodycamel::ConcurrentQueueDefaultTraits>
                      *)pCVar1,token,this,timeStop);
  if (*timeStop == -2) {
    this_local._4_4_ = ConnectionLost;
  }
  else {
    this_local._4_4_ = QueueEmpty;
    if (*timeStop == -1 || sVar2 != 0) {
      this_local._4_4_ = DataDequeued;
    }
  }
  return this_local._4_4_;
}

Assistant:

Profiler::DequeueStatus Profiler::DequeueContextSwitches( tracy::moodycamel::ConsumerToken& token, int64_t& timeStop )
{
    const auto sz = GetQueue().try_dequeue_bulk_single( token, [] ( const uint64_t& ) {},
        [this, &timeStop] ( QueueItem* item, size_t sz )
        {
            assert( sz > 0 );
            int64_t refCtx = m_refTimeCtx;
            while( sz-- > 0 )
            {
                FreeAssociatedMemory( *item );
                if( timeStop < 0 ) return;
                const auto idx = MemRead<uint8_t>( &item->hdr.idx );
                if( idx == (uint8_t)QueueType::ContextSwitch )
                {
                    const auto csTime = MemRead<int64_t>( &item->contextSwitch.time );
                    if( csTime > timeStop )
                    {
                        timeStop = -1;
                        m_refTimeCtx = refCtx;
                        return;
                    }
                    int64_t dt = csTime - refCtx;
                    refCtx = csTime;
                    MemWrite( &item->contextSwitch.time, dt );
                    if( !AppendData( item, QueueDataSize[(int)QueueType::ContextSwitch] ) )
                    {
                        timeStop = -2;
                        m_refTimeCtx = refCtx;
                        return;
                    }
                }
                else if( idx == (uint8_t)QueueType::ThreadWakeup )
                {
                    const auto csTime = MemRead<int64_t>( &item->threadWakeup.time );
                    if( csTime > timeStop )
                    {
                        timeStop = -1;
                        m_refTimeCtx = refCtx;
                        return;
                    }
                    int64_t dt = csTime - refCtx;
                    refCtx = csTime;
                    MemWrite( &item->threadWakeup.time, dt );
                    if( !AppendData( item, QueueDataSize[(int)QueueType::ThreadWakeup] ) )
                    {
                        timeStop = -2;
                        m_refTimeCtx = refCtx;
                        return;
                    }
                }
                item++;
            }
            m_refTimeCtx = refCtx;
        }
    );

    if( timeStop == -2 ) return DequeueStatus::ConnectionLost;
    return ( timeStop == -1 || sz > 0 ) ? DequeueStatus::DataDequeued : DequeueStatus::QueueEmpty;
}